

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cc
# Opt level: O2

void __thiscall gimage::ImageIO::ImageIO(ImageIO *this)

{
  BasicImageIO *local_18;
  
  (this->list).super__Vector_base<gimage::BasicImageIO_*,_std::allocator<gimage::BasicImageIO_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->list).super__Vector_base<gimage::BasicImageIO_*,_std::allocator<gimage::BasicImageIO_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->list).super__Vector_base<gimage::BasicImageIO_*,_std::allocator<gimage::BasicImageIO_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_18 = (BasicImageIO *)operator_new(8);
  local_18->_vptr_BasicImageIO = (_func_int **)&PTR__BasicImageIO_0015b9d8;
  std::vector<gimage::BasicImageIO*,std::allocator<gimage::BasicImageIO*>>::
  emplace_back<gimage::BasicImageIO*>
            ((vector<gimage::BasicImageIO*,std::allocator<gimage::BasicImageIO*>> *)this,&local_18);
  local_18 = (BasicImageIO *)operator_new(8);
  local_18->_vptr_BasicImageIO = (_func_int **)&PTR__BasicImageIO_0015ba78;
  std::vector<gimage::BasicImageIO*,std::allocator<gimage::BasicImageIO*>>::
  emplace_back<gimage::BasicImageIO*>
            ((vector<gimage::BasicImageIO*,std::allocator<gimage::BasicImageIO*>> *)this,&local_18);
  local_18 = (BasicImageIO *)operator_new(8);
  local_18->_vptr_BasicImageIO = (_func_int **)&PTR__BasicImageIO_0015bb18;
  std::vector<gimage::BasicImageIO*,std::allocator<gimage::BasicImageIO*>>::
  emplace_back<gimage::BasicImageIO*>
            ((vector<gimage::BasicImageIO*,std::allocator<gimage::BasicImageIO*>> *)this,&local_18);
  local_18 = (BasicImageIO *)operator_new(8);
  local_18->_vptr_BasicImageIO = (_func_int **)&PTR__BasicImageIO_0015bc58;
  std::vector<gimage::BasicImageIO*,std::allocator<gimage::BasicImageIO*>>::
  emplace_back<gimage::BasicImageIO*>
            ((vector<gimage::BasicImageIO*,std::allocator<gimage::BasicImageIO*>> *)this,&local_18);
  local_18 = (BasicImageIO *)operator_new(8);
  local_18->_vptr_BasicImageIO = (_func_int **)&PTR__BasicImageIO_0015bbb8;
  std::vector<gimage::BasicImageIO*,std::allocator<gimage::BasicImageIO*>>::
  emplace_back<gimage::BasicImageIO*>
            ((vector<gimage::BasicImageIO*,std::allocator<gimage::BasicImageIO*>> *)this,&local_18);
  return;
}

Assistant:

ImageIO::ImageIO()
{
  list.push_back(new PNMImageIO());
  list.push_back(new RAWImageIO());

#ifdef INCLUDE_GDAL
  list.push_back(new GDALImageIO());
#endif

#ifdef INCLUDE_TIFF
  list.push_back(new TIFFImageIO());
#endif

#ifdef INCLUDE_PNG
  list.push_back(new PNGImageIO());
#endif

#ifdef INCLUDE_JPEG
  list.push_back(new JPEGImageIO());
#endif
}